

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O1

Utest * __thiscall
TEST_MinipointCounterTest_OwnAndRoundWindPair_TestShell::createTest
          (TEST_MinipointCounterTest_OwnAndRoundWindPair_TestShell *this)

{
  TEST_MinipointCounterTest_OwnAndRoundWindPair_Test *this_00;
  
  this_00 = (TEST_MinipointCounterTest_OwnAndRoundWindPair_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/minipointcounter_test.cpp"
                         ,0xe4);
  TEST_MinipointCounterTest_OwnAndRoundWindPair_Test::
  TEST_MinipointCounterTest_OwnAndRoundWindPair_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MinipointCounterTest, OwnAndRoundWindPair)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::EastWind);

	addPair(Tile::EastWind);
	addOpenNoPointsHandWithoutPair();
	s.winByDiscard();

	CHECK_EQUAL(24, m.total(false));
}